

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O3

bool __thiscall
opts::
PosOptionContainer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::parse(PosOptionContainer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this,list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *args)

{
  _List_node_base *p_Var1;
  bool bVar2;
  ostream *poVar3;
  char local_19;
  
  p_Var1 = (args->
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 == (_List_node_base *)args) {
    bVar2 = false;
  }
  else {
    bVar2 = Converter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::convert((string *)(p_Var1 + 1),this->var);
    if (!bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: failed to parse ",0x17);
      p_Var1 = (args->
               super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)p_Var1[1]._M_next,(long)p_Var1[1]._M_prev);
      local_19 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_19,1);
    }
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(args,(args->
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl._M_node.super__List_node_base._M_next);
  }
  return bVar2;
}

Assistant:

bool        parse(std::list<std::string>& args) const
    {
        if (args.empty())
            return false;

        bool result = Converter<T>::convert(args.front(), *var);
        if (!result)
            std::cerr << "error: failed to parse " << args.front() << '\n';
        args.pop_front();
        return result;
    }